

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::IntegerFunctionTestInstance::IntegerFunctionTestInstance
          (IntegerFunctionTestInstance *this,Context *context,ShaderType shaderType,ShaderSpec *spec
          ,int numValues,char *name)

{
  ShaderType shaderType_00;
  Context *context_00;
  ShaderExecutor *pSVar1;
  DefaultDeleter<vkt::shaderexecutor::ShaderExecutor> local_51;
  VkDescriptorSetLayout local_50 [3];
  char *local_38;
  char *name_local;
  ShaderSpec *pSStack_28;
  int numValues_local;
  ShaderSpec *spec_local;
  Context *pCStack_18;
  ShaderType shaderType_local;
  Context *context_local;
  IntegerFunctionTestInstance *this_local;
  
  local_38 = name;
  name_local._4_4_ = numValues;
  pSStack_28 = spec;
  spec_local._4_4_ = shaderType;
  pCStack_18 = context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__IntegerFunctionTestInstance_01673040;
  this->m_shaderType = spec_local._4_4_;
  ShaderSpec::ShaderSpec(&this->m_spec,pSStack_28);
  this->m_numValues = name_local._4_4_;
  this->m_name = local_38;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_failMsg);
  context_00 = pCStack_18;
  shaderType_00 = this->m_shaderType;
  ::vk::Handle<(vk::HandleType)19>::Handle(local_50,0);
  pSVar1 = createExecutor(context_00,shaderType_00,&this->m_spec,local_50[0]);
  de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>::DefaultDeleter(&local_51);
  de::details::
  UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::UniquePtr(&this->m_executor,pSVar1);
  return;
}

Assistant:

IntegerFunctionTestInstance		(Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, int numValues, const char* name)
									: TestInstance	(context)
									, m_shaderType	(shaderType)
									, m_spec		(spec)
									, m_numValues	(numValues)
									, m_name		(name)
									, m_executor	(createExecutor(context, m_shaderType, m_spec))
								{
								}